

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

vector<CService,_std::allocator<CService>_> *
Lookup(vector<CService,_std::allocator<CService>_> *__return_storage_ptr__,string *name,
      uint16_t portDefault,bool fAllowLookup,uint nMaxSolutions,DNSLookupFn dns_lookup_function)

{
  bool bVar1;
  undefined6 in_register_00000012;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_R9;
  CNetAddr *addr;
  long in_FS_OFFSET;
  string_view in;
  string_view str;
  uint16_t port;
  string hostname;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  fStack_98;
  vector<CNetAddr,_std::allocator<CNetAddr>_> local_78;
  uint16_t local_5a;
  string local_58;
  long local_38;
  
  str._M_str._2_6_ = in_register_00000012;
  str._M_str._0_2_ = portDefault;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((util *)name->_M_string_length == (util *)0x0) ||
     (str._M_len = (size_t)(name->_M_dataplus)._M_p,
     bVar1 = util::ContainsNoNUL((util *)name->_M_string_length,str), !bVar1)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    in._M_str = (name->_M_dataplus)._M_p;
    in._M_len = name->_M_string_length;
    local_5a = portDefault;
    SplitHostPort(in,&local_5a,&local_58);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function(&fStack_98,in_R9);
    LookupIntern(&local_78,&local_58,nMaxSolutions,fAllowLookup,&fStack_98);
    std::_Function_base::~_Function_base(&fStack_98.super__Function_base);
    (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CService,_std::allocator<CService>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<CService,_std::allocator<CService>_>::reserve
                (__return_storage_ptr__,
                 (long)local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                       super__Vector_impl_data._M_start >> 5);
      for (; local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
             super__Vector_impl_data._M_finish;
          local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
               super__Vector_impl_data._M_start + 1) {
        std::vector<CService,std::allocator<CService>>::
        emplace_back<CNetAddr_const&,unsigned_short&>
                  ((vector<CService,std::allocator<CService>> *)__return_storage_ptr__,
                   local_78.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_5a);
      }
    }
    std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector(&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CService> Lookup(const std::string& name, uint16_t portDefault, bool fAllowLookup, unsigned int nMaxSolutions, DNSLookupFn dns_lookup_function)
{
    if (name.empty() || !ContainsNoNUL(name)) {
        return {};
    }
    uint16_t port{portDefault};
    std::string hostname;
    SplitHostPort(name, port, hostname);

    const std::vector<CNetAddr> addresses{LookupIntern(hostname, nMaxSolutions, fAllowLookup, dns_lookup_function)};
    if (addresses.empty()) return {};
    std::vector<CService> services;
    services.reserve(addresses.size());
    for (const auto& addr : addresses)
        services.emplace_back(addr, port);
    return services;
}